

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  Scl_Item_t *pSVar7;
  Scl_Item_t *pRoot;
  double dVar8;
  double dVar9;
  
  iVar2 = Scl_LibertyItemNum(p,p->pItems,"wire_load_selection");
  Vec_StrPutI_(vOut,iVar2);
  uVar1 = p->pItems->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if (-1 < (int)uVar1) {
      pRoot = p->pItems + uVar1;
      do {
        iVar4 = (pRoot->Key).Beg;
        iVar3 = (pRoot->Key).End - iVar4;
        iVar4 = strncmp(p->pContents + iVar4,"wire_load_selection",(long)iVar3);
        if (iVar3 == 0x13 && iVar4 == 0) {
          pcVar5 = Scl_LibertyReadString(p,pRoot->Head);
          Vec_StrPutS_(vOut,pcVar5);
          iVar2 = Scl_LibertyItemNum(p,pRoot,"wire_load_from_area");
          Vec_StrPutI_(vOut,iVar2);
          uVar1 = pRoot->Child;
          iVar2 = p->nItems;
          if (iVar2 <= (int)uVar1) goto LAB_003e6d9f;
          if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
            pSVar7 = p->pItems + uVar1;
            do {
              iVar4 = (pSVar7->Key).Beg;
              iVar3 = (pSVar7->Key).End - iVar4;
              iVar4 = strncmp(p->pContents + iVar4,"wire_load_from_area",(long)iVar3);
              if (iVar3 == 0x13 && iVar4 == 0) {
                pcVar5 = Scl_LibertyReadString(p,pSVar7->Head);
                pcVar5 = strtok(pcVar5," ,");
                dVar8 = atof(pcVar5);
                pcVar5 = strtok((char *)0x0," ,");
                dVar9 = atof(pcVar5);
                pcVar5 = strtok((char *)0x0," ");
                if (*pcVar5 == '\"') {
                  sVar6 = strlen(pcVar5);
                  if (pcVar5[sVar6 - 1] != '\"') {
                    __assert_fail("pThird[strlen(pThird)-1] == \'\\\"\'",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                  ,900,
                                  "void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *, Vec_Str_t *)");
                  }
                  pcVar5[sVar6 - 1] = '\0';
                  pcVar5 = pcVar5 + 1;
                }
                Vec_StrPutF_(vOut,(float)dVar8);
                Vec_StrPutF_(vOut,(float)dVar9);
                Vec_StrPutS_(vOut,pcVar5);
                iVar2 = p->nItems;
              }
              uVar1 = pSVar7->Next;
              if (iVar2 <= (int)uVar1) goto LAB_003e6d9f;
            } while ((-1 < (int)uVar1) &&
                    (pSVar7 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
          }
        }
        uVar1 = pRoot->Next;
        if (iVar2 <= (int)uVar1) goto LAB_003e6d9f;
      } while ((-1 < (int)uVar1) && (pRoot = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
    }
    return;
  }
LAB_003e6d9f:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

void Scl_LibertyReadWireLoadSelect( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load_selection") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load_selection" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "wire_load_from_area") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "wire_load_from_area" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            float  First  = atof( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ,") );
            char * pThird = strtok(NULL, " ");
            if ( pThird[0] == '\"' )
                assert(pThird[strlen(pThird)-1] == '\"'), pThird[strlen(pThird)-1] = 0, pThird++;
            Vec_StrPutF_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPutS_( vOut, pThird );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}